

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::_::CidrRange>::setCapacity(Vector<kj::_::CidrRange> *this,size_t newSize)

{
  CidrRange *pCVar1;
  RemoveConst<kj::_::CidrRange> *pRVar2;
  CidrRange *pCVar3;
  ulong uVar4;
  size_t __n;
  ArrayBuilder<kj::_::CidrRange> local_48;
  
  pCVar1 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pCVar1 >> 3) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pCVar1 + newSize;
  }
  pCVar3 = (CidrRange *)
           _::HeapArrayDisposer::allocateImpl
                     (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = pCVar3 + newSize;
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pCVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pCVar1;
  local_48.ptr = pCVar3;
  if (__n != 0) {
    memcpy(pCVar3,pCVar1,__n);
  }
  local_48.pos = (RemoveConst<kj::_::CidrRange> *)((long)pCVar3 + __n);
  ArrayBuilder<kj::_::CidrRange>::operator=(&this->builder,&local_48);
  pCVar3 = local_48.endPtr;
  pRVar2 = local_48.pos;
  pCVar1 = local_48.ptr;
  if (local_48.ptr != (CidrRange *)0x0) {
    local_48.ptr = (CidrRange *)0x0;
    local_48.pos = (RemoveConst<kj::_::CidrRange> *)0x0;
    local_48.endPtr = (CidrRange *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pCVar1,0x18,
               ((long)pRVar2 - (long)pCVar1 >> 3) * -0x5555555555555555,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x5555555555555555,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }